

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

void __thiscall
OpenMD::SquareMatrix3<double>::setupRotMat
          (SquareMatrix3<double> *this,double w,double x,double y,double z)

{
  SquareMatrix<double,_3> *in_RDI;
  Quaternion<double> q;
  Quaternion<double> *in_stack_000001d8;
  double in_stack_ffffffffffffff58;
  SquareMatrix3<double> *this_00;
  double in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  Quaternion<double> *in_stack_ffffffffffffff70;
  
  Quaternion<double>::Quaternion
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,(double)in_RDI);
  this_00 = (SquareMatrix3<double> *)&stack0xffffffffffffff70;
  Quaternion<double>::toRotationMatrix3(in_stack_000001d8);
  operator=(this_00,in_RDI);
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x158640);
  return;
}

Assistant:

void setupRotMat(Real w, Real x, Real y, Real z) {
      Quaternion<Real> q(w, x, y, z);
      *this = q.toRotationMatrix3();
    }